

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.c
# Opt level: O1

void traverse(int i)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  int iVar4;
  Yshort *pYVar5;
  Yshort *pYVar6;
  long lVar7;
  uint *puVar8;
  ulong uVar9;
  uint *puVar10;
  int iVar11;
  long lVar12;
  uint *puVar13;
  uint *puVar14;
  
  pYVar6 = VERTICES;
  lVar7 = (long)top;
  iVar11 = top + 1;
  top = iVar11;
  VERTICES[lVar7 + 1] = i;
  pYVar5 = INDEX;
  INDEX[i] = iVar11;
  puVar3 = F;
  iVar2 = tokensetsize;
  lVar7 = (long)tokensetsize;
  puVar14 = F + tokensetsize * i;
  puVar13 = (uint *)R[i];
  if (puVar13 != (uint *)0x0) {
    uVar1 = *puVar13;
    while (-1 < (int)uVar1) {
      if (pYVar5[uVar1] == 0) {
        traverse(uVar1);
      }
      if (pYVar5[uVar1] < pYVar5[i]) {
        pYVar5[i] = pYVar5[uVar1];
      }
      if (0 < iVar2) {
        puVar8 = puVar3 + (long)(int)uVar1 * (long)tokensetsize;
        puVar10 = puVar14;
        do {
          *puVar10 = *puVar10 | *puVar8;
          puVar8 = puVar8 + 1;
          puVar10 = puVar10 + 1;
        } while (puVar10 < puVar14 + lVar7);
      }
      puVar13 = puVar13 + 1;
      uVar1 = *puVar13;
    }
  }
  iVar4 = infinity;
  if (pYVar5[i] == iVar11) {
    uVar9 = (ulong)(top - 1U);
    iVar11 = pYVar6[top];
    lVar12 = (long)iVar11;
    pYVar5[lVar12] = infinity;
    if (iVar11 != i) {
      uVar9 = (ulong)(int)(top - 1U);
      do {
        if (0 < iVar2) {
          puVar10 = puVar3 + (long)(int)lVar12 * (long)tokensetsize;
          puVar13 = puVar14;
          do {
            uVar1 = *puVar13;
            puVar13 = puVar13 + 1;
            *puVar10 = uVar1;
            puVar10 = puVar10 + 1;
          } while (puVar13 < puVar14 + lVar7);
        }
        iVar11 = pYVar6[uVar9];
        lVar12 = (long)iVar11;
        uVar9 = uVar9 - 1;
        pYVar5[lVar12] = iVar4;
      } while (iVar11 != i);
    }
    top = (int)uVar9;
  }
  return;
}

Assistant:

void traverse(int i)
{
  register unsigned *fp1;
  register unsigned *fp2;
  register unsigned *fp3;
  register int j;
  register Yshort *rp;

  int height;
  unsigned *base;

  VERTICES[++top] = i;
  INDEX[i] = height = top;

  base = F + i * tokensetsize;
  fp3 = base + tokensetsize;

  rp = R[i];
  if (rp)
    {
      while ((j = *rp++) >= 0)
	{
	  if (INDEX[j] == 0)
	    traverse(j);

	  if (INDEX[i] > INDEX[j])
	    INDEX[i] = INDEX[j];

	  fp1 = base;
	  fp2 = F + j * tokensetsize;

	  while (fp1 < fp3)
	    *fp1++ |= *fp2++;
	}
    }

  if (INDEX[i] == height)
    {
      for (;;)
	{
	  j = VERTICES[top--];
	  INDEX[j] = infinity;

	  if (i == j)
	    break;

	  fp1 = base;
	  fp2 = F + j * tokensetsize;

	  while (fp1 < fp3)
	    *fp2++ = *fp1++;
	}
    }
}